

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void pta_free(matras_allocator *allocator,void *p)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  void *local_18;
  void *p_local;
  matras_allocator *allocator_local;
  
  local_18 = p;
  p_local = allocator;
  local_20._M_node =
       (_Base_ptr)
       std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::find
                 (&AllocatedBlocks,&local_18);
  local_28._M_node =
       (_Base_ptr)
       std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::end(&AllocatedBlocks);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::erase(&AllocatedBlocks,&local_18);
    if (local_18 != (void *)0x0) {
      operator_delete__(local_18);
    }
    AllocatedCount = AllocatedCount - 1;
    return;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
          "AllocatedBlocks.find(p) != AllocatedBlocks.end()","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x29,
          "pta_free");
  exit(-1);
}

Assistant:

static void
pta_free(struct matras_allocator *allocator, void *p)
{
	(void)allocator;
	fail_unless(AllocatedBlocks.find(p) != AllocatedBlocks.end());
	AllocatedBlocks.erase(p);
	delete [] static_cast<char *>(p);
	AllocatedCount--;
}